

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixellayout.cpp
# Opt level: O2

QRgbaFloat32 *
fetchARGBToRGBA32F<(QImage::Format)5>
          (QRgbaFloat32 *buffer,uchar *src,int index,int count,QList<unsigned_int> *param_5,
          QDitherInfo *param_6)

{
  float *pfVar1;
  ulong uVar2;
  ulong uVar3;
  float fVar4;
  QRgbaFloat<float> QVar5;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)count;
  if (count < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 * 4 != uVar3; uVar3 = uVar3 + 4) {
    QVar5 = QRgbaFloat<float>::fromArgb32(*(uint *)(src + uVar3 + (long)index * 4));
    fVar4 = QVar5.a;
    pfVar1 = &buffer->r + uVar3;
    *pfVar1 = QVar5.r * fVar4;
    pfVar1[1] = QVar5.g * fVar4;
    pfVar1[2] = fVar4 * QVar5.b;
    pfVar1[3] = fVar4;
  }
  return buffer;
}

Assistant:

static const QRgbaFloat32 *QT_FASTCALL fetchARGBToRGBA32F(QRgbaFloat32 *buffer, const uchar *src, int index, int count,
                                                      const QList<QRgb> *, QDitherInfo *)
{
    constexpr QPixelLayout::BPP bpp = bitsPerPixel<Format>();
    for (int i = 0; i < count; ++i)
        buffer[i] = convertPixelToRGBA32F<Format>(fetchPixel<bpp>(src, index + i)).premultiplied();
    return buffer;
}